

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O3

int __thiscall
TSDemuxer::simpleDemuxBlock
          (TSDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,int64_t *discardSize)

{
  size_t num;
  char cVar1;
  uint uVar2;
  _Rb_tree_color _Var3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  undefined4 extraout_var;
  ulong uVar11;
  uint *puVar12;
  TS_program_map_section *this_00;
  int64_t iVar13;
  long lVar14;
  mapped_type *pmVar15;
  int64_t iVar16;
  undefined4 *puVar17;
  _Base_ptr p_Var18;
  uint uVar19;
  long lVar20;
  _Rb_tree_header *p_Var21;
  size_t sVar22;
  long lVar23;
  _Base_ptr p_Var24;
  pointer puVar25;
  _Base_ptr p_Var26;
  _Rb_tree_header *p_Var27;
  byte bVar28;
  PIDSet *__range2;
  _Rb_tree_header *p_Var29;
  uint8_t *puVar30;
  uint *puVar31;
  uint *end;
  bool isFirstBlock;
  uint32_t readedBytes;
  int readRez;
  TS_program_association_section pat;
  int acceptedPID;
  uint8_t pmtBuffer [4096];
  PESPacket *local_1270;
  uint local_1244;
  TS_program_map_section *local_1240;
  _Rb_tree_color local_1234;
  int64_t local_1230;
  uint *local_1228;
  int local_121c;
  _Rb_tree_header *local_1218;
  undefined1 *local_1210;
  undefined8 local_1208;
  undefined1 local_1200;
  undefined7 uStack_11ff;
  undefined8 uStack_11f8;
  long local_11f0;
  TS_program_association_section local_11e8;
  _Rb_tree_color local_11b0 [94];
  uint8_t local_1038 [4104];
  
  if (this->m_firstDemuxCall == true) {
    for (p_Var9 = (acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      this->m_acceptedPidCache[(int)p_Var9[1]._M_color] = '\x01';
    }
    this->m_firstDemuxCall = false;
  }
  memset(local_1038,0,0x1000);
  p_Var10 = (acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var29 = &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var29) {
    do {
      local_11b0[0] = p_Var10[1]._M_color;
      std::
      map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>::
      operator[](demuxedData,(key_type_conflict *)local_11b0);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var29);
  }
  *discardSize = 0;
  local_121c = 0;
  iVar6 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_1244,&local_121c);
  if (local_121c == 2) {
    this->m_lastReadRez = 2;
    iVar6 = 2;
  }
  else {
    sVar22 = this->m_tmpBufferLen;
    if ((sVar22 + local_1244 == 0) || ((local_1244 == 0 && (this->m_lastReadRez == 1)))) {
      this->m_lastReadRez = local_121c;
      iVar6 = 1;
    }
    else {
      if (local_1244 != 0) {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)local_1244);
        sVar22 = this->m_tmpBufferLen;
      }
      this->m_lastReadRez = local_121c;
      puVar31 = (uint *)(CONCAT44(extraout_var,iVar6) + 0xbc);
      if (0 < (long)sVar22) {
        memcpy((void *)((long)puVar31 - sVar22),this->m_tmpBuffer,sVar22);
        puVar31 = (uint *)((long)puVar31 - this->m_tmpBufferLen);
        local_1244 = local_1244 + (int)this->m_tmpBufferLen;
        this->m_tmpBufferLen = 0;
      }
      *discardSize = 0;
      uVar11 = (ulong)local_1244;
      if (uVar11 < 0xbc) {
        *discardSize = uVar11;
        iVar6 = 0;
      }
      else {
        end = (uint *)((long)puVar31 + (uVar11 - 0xbc));
        local_1228 = puVar31;
        if ((this->m_firstCall == true) && (this->m_m2tsMode == false)) {
          bVar5 = checkForRealM2ts(this,(uint8_t *)puVar31,(uint8_t *)end);
          this->m_m2tsMode = bVar5;
          this->m_firstCall = false;
        }
        bVar28 = this->m_m2tsHdrDiscarded;
        if (((this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (bVar5 = mvcContinueExpected(this), bVar5)) {
          local_1240 = &this->m_pmt;
          TS_program_association_section::TS_program_association_section(&local_11e8);
          this->m_curPos = (uint8_t *)local_1228;
          iVar6 = 0;
          puVar31 = local_1228;
          do {
            if (((bVar28 & 1) == 0) && (this->m_m2tsMode == true)) {
              puVar31 = puVar31 + 1;
              this->m_curPos = (uint8_t *)puVar31;
            }
            cVar1 = (char)*puVar31;
            while ((cVar1 != 'G' && (puVar31 <= end))) {
              puVar31 = (uint *)((long)puVar31 + 1);
              this->m_curPos = (uint8_t *)puVar31;
              cVar1 = *(char *)puVar31;
            }
            if (end < puVar31) break;
            uVar2 = *puVar31;
            uVar7 = (byte)puVar31[1] + 5;
            if ((uVar2 >> 0x1d & 1) == 0) {
              uVar7 = 4;
            }
            if (0xbc < uVar7) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_11b0,"Invalid tsPacket->getHeaderSize",0x1f);
              puVar17 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar17 = 3;
              *(undefined4 **)(puVar17 + 2) = puVar17 + 6;
              if (local_1210 == &local_1200) {
                *(ulong *)(puVar17 + 6) = CONCAT71(uStack_11ff,local_1200);
                *(undefined8 *)(puVar17 + 8) = uStack_11f8;
              }
              else {
                *(undefined1 **)(puVar17 + 2) = local_1210;
                *(ulong *)(puVar17 + 6) = CONCAT71(uStack_11ff,local_1200);
              }
              *(undefined8 *)(puVar17 + 4) = local_1208;
              local_1208 = 0;
              local_1200 = 0;
              local_1210 = &local_1200;
              __cxa_throw(puVar17,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            uVar19 = uVar2 >> 0x10 & 0xff | uVar2 & 0x1f00;
            if (uVar19 == 0) {
              TS_program_association_section::deserialize
                        (&local_11e8,(uint8_t *)((long)puVar31 + (ulong)uVar7),0xbc - uVar7);
            }
            else if (local_11e8.pmtPids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                     (_Base_ptr)0x0) {
              p_Var10 = &local_11e8.pmtPids._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var18 = local_11e8.pmtPids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var24 = p_Var18;
                p_Var26 = p_Var10;
                _Var3 = p_Var24[1]._M_color;
                p_Var10 = p_Var24;
                if ((int)_Var3 < (int)uVar19) {
                  p_Var10 = p_Var26;
                }
                p_Var18 = (&p_Var24->_M_left)[(int)_Var3 < (int)uVar19];
              } while ((&p_Var24->_M_left)[(int)_Var3 < (int)uVar19] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var10 !=
                  &local_11e8.pmtPids._M_t._M_impl.super__Rb_tree_header) {
                if ((int)_Var3 < (int)uVar19) {
                  p_Var24 = p_Var26;
                }
                if (((int)p_Var24[1]._M_color <= (int)uVar19) &&
                   (((uVar2 >> 0xe & 1) != 0 || (0 < iVar6)))) {
                  if (0x1000 < (int)((iVar6 - uVar7) + 0xbc)) break;
                  memcpy(local_1038 + iVar6,(char *)((ulong)uVar7 + (long)puVar31),
                         (long)(int)(0xbc - uVar7));
                  iVar8 = (byte)puVar31[1] + 5;
                  if ((*puVar31 >> 0x1d & 1) == 0) {
                    iVar8 = 4;
                  }
                  iVar6 = (iVar6 - iVar8) + 0xbc;
                  bVar5 = TS_program_map_section::isFullBuff(local_1038,iVar6);
                  if (bVar5) {
                    TS_program_map_section::deserialize(local_1240,local_1038,iVar6);
                    iVar6 = 0;
                    if ((this->m_pmt).video_type != 0x20) {
                      this->m_nonMVCVideoFound = true;
                    }
                  }
                }
              }
            }
            puVar31 = (uint *)(this->m_curPos + 0xbc);
            this->m_curPos = (uint8_t *)puVar31;
            bVar28 = 0;
          } while (puVar31 <= end);
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree(&local_11e8.pmtPids._M_t);
        }
        this->m_curPos = (uint8_t *)local_1228;
        p_Var29 = &(this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header;
        local_1218 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
        local_1234 = ~_S_red;
        local_1240 = (TS_program_map_section *)0x0;
        puVar31 = local_1228;
        do {
          if ((this->m_m2tsHdrDiscarded == false) && (this->m_m2tsMode == true)) {
            *discardSize = *discardSize + 4;
            puVar31 = puVar31 + 1;
            this->m_curPos = (uint8_t *)puVar31;
          }
          if (end < puVar31) {
LAB_001d4fe6:
            this->m_m2tsHdrDiscarded = true;
            break;
          }
          lVar20 = *discardSize;
          lVar23 = 0;
          while (*(char *)((long)puVar31 + lVar23) != 'G') {
            *discardSize = lVar20 + lVar23 + 1;
            puVar12 = (uint *)((long)puVar31 + lVar23 + 1);
            this->m_curPos = (uint8_t *)puVar12;
            lVar23 = lVar23 + 1;
            if (end < puVar12) {
              puVar31 = (uint *)((long)puVar31 + lVar23);
              goto LAB_001d4fe6;
            }
          }
          this->m_m2tsHdrDiscarded = false;
          local_11b0[0] =
               *(_Rb_tree_color *)((long)puVar31 + lVar23) >> 0x10 & 0xff |
               *(_Rb_tree_color *)((long)puVar31 + lVar23) & 0x1f00;
          *discardSize = lVar20 + lVar23 + 0xbc;
          lVar20 = (ulong)*(byte *)((long)puVar31 + lVar23 + 4) + 5;
          if ((*(uint *)((long)puVar31 + lVar23) >> 0x1d & 1) == 0) {
            lVar20 = 4;
          }
          local_1270 = (PESPacket *)((long)puVar31 + lVar20 + lVar23);
          if ((((*(char *)((long)puVar31 + lVar20 + lVar23) == '\0') &&
               (*(char *)((long)puVar31 + lVar23 + 1 + lVar20) == '\0')) &&
              ((*(uint *)((long)puVar31 + lVar23) >> 0xe & 1) != 0)) &&
             (*(char *)((long)puVar31 + lVar23 + 2 + lVar20) == '\x01')) {
            p_Var10 = (this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var18 = &p_Var29->_M_header;
            p_Var27 = p_Var29;
            if (p_Var10 != (_Base_ptr)0x0) {
              do {
                if ((int)local_11b0[0] <= (int)*(size_t *)(p_Var10 + 1)) {
                  p_Var18 = p_Var10;
                }
                p_Var10 = (&p_Var10->_M_left)[(int)*(size_t *)(p_Var10 + 1) < (int)local_11b0[0]];
              } while (p_Var10 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var18 != p_Var29) &&
                 (p_Var27 = (_Rb_tree_header *)p_Var18,
                 (int)local_11b0[0] < (int)((_Rb_tree_header *)p_Var18)->_M_node_count)) {
                p_Var27 = p_Var29;
              }
            }
            if (*(char *)((long)puVar31 + lVar23 + 7 + lVar20) < '\0') {
              iVar13 = PESPacket::getPts(local_1270);
              local_1230 = iVar13;
              if (0xbf < *(byte *)((long)puVar31 + lVar23 + lVar20 + 7)) {
                iVar13 = PESPacket::getDts(local_1270);
              }
              if ((this->m_lastPTS == -1) || (this->m_lastPTS < local_1230)) {
                this->m_lastPTS = local_1230;
              }
              if ((this->m_firstPTS == -1) || (local_1230 < this->m_firstPTS)) {
                this->m_firstPTS = local_1230;
              }
              if ((p_Var27 != p_Var29) &&
                 (local_11f0 = iVar13, bVar5 = isVideoPID(*(StreamType *)(p_Var27 + 1)), bVar5)) {
                if ((this->m_firstVideoPTS == -1) || (local_1230 < this->m_firstVideoPTS)) {
                  this->m_firstVideoPTS = local_1230;
                }
                if (this->m_lastVideoPTS < local_1230) {
                  this->m_lastVideoPTS = local_1230;
                }
                lVar14 = this->m_lastVideoDTS;
                if (this->m_lastVideoDTS == -1) {
                  this->m_lastVideoDTS = local_11f0;
                  lVar14 = local_11f0;
                }
                if ((this->m_videoDtsGap == -1) &&
                   (local_11f0 - lVar14 != 0 && lVar14 <= local_11f0)) {
                  this->m_videoDtsGap = local_11f0 - lVar14;
                }
              }
              p_Var10 = (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              p_Var21 = local_1218;
              if (p_Var10 != (_Base_ptr)0x0) {
                do {
                  if ((int)local_11b0[0] <= (int)*(size_t *)(p_Var10 + 1)) {
                    p_Var21 = (_Rb_tree_header *)p_Var10;
                  }
                  p_Var10 = (&p_Var10->_M_left)[(int)*(size_t *)(p_Var10 + 1) < (int)local_11b0[0]];
                } while (p_Var10 != (_Base_ptr)0x0);
                if (((p_Var21 != local_1218) && ((int)p_Var21->_M_node_count <= (int)local_11b0[0]))
                   && ((this->m_curFileNum != 0 ||
                       (pmVar15 = std::
                                  map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                                  ::operator[](&this->m_firstPtsTime,(key_type_conflict *)local_11b0
                                              ), *pmVar15 <= local_1230)))) goto LAB_001d4eb1;
              }
              pmVar15 = std::
                        map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                        ::operator[](&this->m_firstPtsTime,(key_type_conflict *)local_11b0);
              *pmVar15 = local_1230;
            }
LAB_001d4eb1:
            if ((p_Var27 == p_Var29) || (*(int *)(p_Var27 + 1) == 0x90)) {
              lVar14 = this->m_firstVideoPTS;
              if (lVar14 == -1) {
                lVar14 = this->m_firstPTS;
              }
              bVar28 = *(byte *)((long)puVar31 + lVar23 + lVar20 + 7);
              if (bVar28 < 0xc0) {
                if ((char)bVar28 < '\0') {
                  iVar13 = PESPacket::getPts(local_1270);
                  PESPacket::setPts(local_1270,(iVar13 - lVar14) + this->m_prevFileLen);
                }
              }
              else {
                iVar13 = PESPacket::getPts(local_1270);
                lVar20 = this->m_prevFileLen;
                iVar16 = PESPacket::getDts(local_1270);
                PESPacket::setPtsAndDts
                          (local_1270,(iVar13 - lVar14) + lVar20,
                           (iVar16 - lVar14) + this->m_prevFileLen);
              }
            }
            else {
              local_1270 = (PESPacket *)
                           ((long)puVar31 +
                           (ulong)(byte)(*(char *)((long)puVar31 + lVar23 + 8 + lVar20) + 9) +
                           lVar23 + lVar20);
            }
          }
          puVar30 = this->m_curPos;
          if (this->m_acceptedPidCache[(int)local_11b0[0]] != '\0') {
            num = ((long)puVar30 - (long)local_1270) + 0xbc;
            if (0 < (long)num) {
              if (local_11b0[0] == local_1234) {
                this_00 = local_1240;
                if (local_1240 == (TS_program_map_section *)0x0) {
                  local_1240 = (TS_program_map_section *)0x0;
                  goto LAB_001d4ca5;
                }
              }
              else {
                this_00 = (TS_program_map_section *)
                          std::
                          map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                          ::operator[](demuxedData,(key_type_conflict *)local_11b0);
                local_1234 = local_11b0[0];
              }
              MemoryBlock::grow((MemoryBlock *)this_00,num);
              puVar4 = (((MemoryBlock *)this_00)->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar25 = (pointer)0x0;
              if (puVar4 != (((MemoryBlock *)this_00)->m_data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                puVar25 = puVar4;
              }
              local_1240 = this_00;
              memcpy(puVar25 + (((MemoryBlock *)this_00)->m_size -
                               ((long)puVar30 - (long)local_1270)) + -0xbc,local_1270,num);
              puVar30 = this->m_curPos;
            }
LAB_001d4ca5:
            *discardSize = *discardSize - num;
          }
          puVar31 = (uint *)(puVar30 + 0xbc);
          this->m_curPos = (uint8_t *)puVar31;
        } while (puVar31 <= end);
        iVar6 = 0;
        if (puVar31 < (uint *)((long)local_1228 + (ulong)local_1244)) {
          sVar22 = (long)((long)local_1228 + (ulong)local_1244) - (long)puVar31;
          this->m_tmpBufferLen = sVar22;
          memmove(this->m_tmpBuffer,puVar31,sVar22);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int TSDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        for (const int acceptedPID : acceptedPIDs) m_acceptedPidCache[acceptedPID] = 1;
        m_firstDemuxCall = false;
    }

    uint8_t pmtBuffer[4096]{0};
    int pmtBufferLen = 0;
    MemoryBlock* vect = nullptr;
    int lastPid = -1;

    for (int acceptedPID : acceptedPIDs) demuxedData[acceptedPID];

    discardSize = 0;
    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += TS_FRAME_SIZE;
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += static_cast<uint32_t>(m_tmpBufferLen);
        m_tmpBufferLen = 0;
    }

    if (isFirstBlock)
    {
        if (m_curFileNum < m_mplsInfo.size())
            m_prevFileLen +=
                static_cast<int64_t>(m_mplsInfo[m_curFileNum].OUT_time - m_mplsInfo[m_curFileNum].IN_time) *
                2;  // in 90Khz clock
        else
        {
            if (m_firstVideoPTS != -1 && m_lastVideoPTS != -1)
                m_prevFileLen += (m_lastVideoPTS - m_firstVideoPTS + m_videoDtsGap);
            else  // no video file
                m_prevFileLen += (m_lastPTS - m_firstPTS);
        }
        m_firstPTS = -1;
        m_lastPTS = -1;
        m_firstVideoPTS = -1;
        m_lastVideoPTS = -1;
        m_curFileNum++;
    }

    discardSize = 0;

    if (readedBytes < TS_FRAME_SIZE)
    {
        discardSize += readedBytes;
        return 0;
    }

    const uint8_t* lastFrameAddr = data + readedBytes - TS_FRAME_SIZE;

    if (m_firstCall && !m_m2tsMode)
    {
        m_m2tsMode = checkForRealM2ts(data, lastFrameAddr);
        m_firstCall = false;
    }

    bool forpmtm2tsHdrDiscarded = m_m2tsHdrDiscarded;
    if (m_pmt.pidList.empty() || mvcContinueExpected())
    {
        TS_program_association_section pat;
        for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
        {
            if (!forpmtm2tsHdrDiscarded && m_m2tsMode)
                m_curPos += 4;
            while (*m_curPos != 0x47 && m_curPos <= lastFrameAddr) m_curPos++;
            if (m_curPos > lastFrameAddr)
                break;
            forpmtm2tsHdrDiscarded = false;

            const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
            int pid = tsPacket->getPID();
            if (TS_FRAME_SIZE < tsPacket->getHeaderSize())
            {
                THROW(ERR_COMMON, "Invalid tsPacket->getHeaderSize")
                break;
            }
            if (pid == 0)
            {  // PAT
                pat.deserialize(m_curPos + tsPacket->getHeaderSize(), TS_FRAME_SIZE - tsPacket->getHeaderSize());
            }
            else if (pat.pmtPids.find(pid) != pat.pmtPids.end())
            {  // PMT
                if (tsPacket->payloadStart || pmtBufferLen > 0)
                {
                    if (pmtBufferLen + TS_FRAME_SIZE - tsPacket->getHeaderSize() > 4096)
                        break;
                    memcpy(pmtBuffer + pmtBufferLen, m_curPos + tsPacket->getHeaderSize(),
                           TS_FRAME_SIZE - tsPacket->getHeaderSize());
                    pmtBufferLen += TS_FRAME_SIZE - tsPacket->getHeaderSize();
                    if (TS_program_map_section::isFullBuff(pmtBuffer, pmtBufferLen))
                    {
                        m_pmt.deserialize(pmtBuffer, pmtBufferLen);
                        if (m_pmt.video_type != static_cast<int>(StreamType::VIDEO_MVC))
                            m_nonMVCVideoFound = true;
                        pmtBufferLen = 0;
                    }
                }
            }
        }
    }

    for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
    {
        if (!m_m2tsHdrDiscarded && m_m2tsMode)
        {
            discardSize += 4;
            m_curPos += 4;
        }
        while (m_curPos <= lastFrameAddr && *m_curPos != 0x47)
        {
            discardSize++;
            m_curPos++;
        }
        if (m_curPos > lastFrameAddr)
        {
            m_m2tsHdrDiscarded = true;
            break;
        }
        m_m2tsHdrDiscarded = false;

        const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
        int pid = tsPacket->getPID();
        discardSize += TS_FRAME_SIZE;

        // pcrFrames++;

        if (tsPacket->afExists)
        {
            if (tsPacket->adaptiveField.pcrExist)
            {
                // if (prevPCR == -1)
                //	prevPCR = tsPacket->adaptiveField.getPCR33();

                // prevPCR = tsPacket->adaptiveField.getPCR33();
                // LTRACE(LT_INFO, 2, "pcr: " << prevPCR - 55729419ll);
                // pcrFrames = 0;
            }
        }

        uint8_t* frameData = m_curPos + tsPacket->getHeaderSize();
        const bool pesStartCode = frameData[0] == 0 && frameData[1] == 0 && frameData[2] == 1 && tsPacket->payloadStart;
        if (pesStartCode)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(frameData);
            auto streamInfo = m_pmt.pidList.find(pid);

            if ((pesPacket->flagsLo & 0x80) == 0x80)
            {
                const int64_t curPts = pesPacket->getPts();
                int64_t curDts = curPts;

                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                    curDts = pesPacket->getDts();

                if (m_lastPTS == -1 || curPts > m_lastPTS)
                    m_lastPTS = curPts;

                if (m_firstPTS == -1 || curPts < m_firstPTS)
                    m_firstPTS = curPts;

                if (streamInfo != m_pmt.pidList.end() && isVideoPID(streamInfo->second.m_streamType))
                {
                    if (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS)
                        m_firstVideoPTS = curPts;
                    if (curPts > m_lastVideoPTS)
                        m_lastVideoPTS = curPts;
                    if (m_lastVideoDTS == -1)
                        m_lastVideoDTS = curDts;
                    if (m_videoDtsGap == -1 && curDts > m_lastVideoDTS)
                        m_videoDtsGap = curDts - m_lastVideoDTS;
                }

                if (m_firstPtsTime.find(pid) == m_firstPtsTime.end() ||
                    (m_curFileNum == 0 && curPts < m_firstPtsTime[pid]))
                    m_firstPtsTime[pid] = curPts;
            }

            if (streamInfo != m_pmt.pidList.end() &&
                streamInfo->second.m_streamType != StreamType::SUB_PGS)  // demux PGS with PES headers
                frameData += pesPacket->getHeaderLength();
            else
            {
                const int64_t ptsBase = m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS;
                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    const int64_t dts = pesPacket->getDts() - ptsBase + m_prevFileLen;
                    pesPacket->setPtsAndDts(pts, dts);
                }
                else if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    pesPacket->setPts(pts);
                }
            }
        }

        // if (acceptedPIDs.find(pid) == acceptedPIDs.end())
        if (!m_acceptedPidCache[pid])
            continue;

        const int64_t payloadLen = TS_FRAME_SIZE - (frameData - m_curPos);
        if (payloadLen > 0)
        {
            if (pid != lastPid)
            {
                vect = &demuxedData[pid];
                lastPid = pid;
            }
            if (vect != nullptr)
            {
                vect->grow(payloadLen);
                uint8_t* dst = vect->data() + vect->size() - payloadLen;
                memcpy(dst, frameData, payloadLen);
            }
        }
        discardSize -= payloadLen;
    }
    if (m_curPos < data + readedBytes)
    {
        m_tmpBufferLen = data + readedBytes - m_curPos;
        memmove(m_tmpBuffer, m_curPos, m_tmpBufferLen);
    }

    return 0;
}